

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void determine_constants_arrays(Context *ctx)

{
  undefined8 uVar1;
  long lVar2;
  ConstantsList **ctx_00;
  ConstantsList *pCVar3;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  VariableList *var;
  int hi;
  int count;
  int prev;
  int start;
  ConstantsList *tmp;
  int sorted;
  int i;
  ConstantsList *item;
  ConstantsList **array;
  Context *ctx_local;
  
  if ((ctx->determined_constants_arrays == 0) &&
     (ctx->determined_constants_arrays = 1, 1 < ctx->constant_count)) {
    lVar2 = -((long)ctx->constant_count * 8 + 0x17U & 0xfffffffffffffff0);
    pCVar3 = (ConstantsList *)(local_48 + lVar2);
    _sorted = ctx->constants;
    for (tmp._4_4_ = 0; item = pCVar3, array = (ConstantsList **)ctx,
        tmp._4_4_ < ctx->constant_count; tmp._4_4_ = tmp._4_4_ + 1) {
      if (_sorted == (ConstantsList *)0x0) {
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11ed8e;
        fail(ctx,"BUG: mismatched constant list and count");
        return;
      }
      *(ConstantsList **)(&(pCVar3->constant).type + (long)tmp._4_4_ * 2) = _sorted;
      _sorted = _sorted->next;
    }
    *(undefined8 *)(&(pCVar3->constant).type + (long)ctx->constant_count * 2) = 0;
    do {
      tmp._0_4_ = 1;
      for (tmp._4_4_ = 0; tmp._4_4_ < ctx->constant_count + -1; tmp._4_4_ = tmp._4_4_ + 1) {
        if (*(int *)(*(long *)(&(pCVar3->constant).type + (long)(tmp._4_4_ + 1) * 2) + 4) <
            *(int *)(*(long *)(&(pCVar3->constant).type + (long)tmp._4_4_ * 2) + 4)) {
          uVar1 = *(undefined8 *)(&(pCVar3->constant).type + (long)tmp._4_4_ * 2);
          *(undefined8 *)(&(pCVar3->constant).type + (long)tmp._4_4_ * 2) =
               *(undefined8 *)(&(pCVar3->constant).type + (long)(tmp._4_4_ + 1) * 2);
          *(undefined8 *)(&(pCVar3->constant).type + (long)(tmp._4_4_ + 1) * 2) = uVar1;
          tmp._0_4_ = 0;
          _prev = uVar1;
        }
      }
    } while ((int)tmp == 0);
    for (tmp._4_4_ = 0; tmp._4_4_ < ctx->constant_count; tmp._4_4_ = tmp._4_4_ + 1) {
      *(undefined8 *)(*(long *)(&(pCVar3->constant).type + (long)tmp._4_4_ * 2) + 0x18) =
           *(undefined8 *)(&(pCVar3->constant).type + (long)(tmp._4_4_ + 1) * 2);
    }
    ctx->constants = *(ConstantsList **)&pCVar3->constant;
    count = -1;
    hi = -1;
    var._4_4_ = 0;
    var._0_4_ = ctx->constant_count;
    for (tmp._4_4_ = 0; ctx_00 = array, tmp._4_4_ <= (int)var; tmp._4_4_ = tmp._4_4_ + 1) {
      if ((*(long *)(&(item->constant).type + (long)tmp._4_4_ * 2) == 0) ||
         (**(int **)(&(item->constant).type + (long)tmp._4_4_ * 2) == 0)) {
        if (count == -1) {
          count = tmp._4_4_;
          hi = tmp._4_4_;
        }
        else {
          if ((*(long *)(&(item->constant).type + (long)tmp._4_4_ * 2) == 0) ||
             (*(int *)(*(long *)(&(item->constant).type + (long)tmp._4_4_ * 2) + 4) !=
              *(int *)(*(long *)(&(item->constant).type + (long)hi * 2) + 4) + 1)) {
            if (0 < var._4_4_) {
              *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11efa0;
              local_48 = (undefined1  [8])Malloc((Context *)ctx_00,0x28);
              if (local_48 == (undefined1  [8])0x0) {
                return;
              }
              (((ConstantsList *)local_48)->constant).type = MOJOSHADER_UNIFORM_FLOAT;
              (((ConstantsList *)local_48)->constant).index =
                   *(int *)(*(long *)(&(item->constant).type + (long)count * 2) + 4);
              (((ConstantsList *)local_48)->constant).value.i[0] =
                   (*(int *)(*(long *)(&(item->constant).type + (long)hi * 2) + 4) -
                   (((ConstantsList *)local_48)->constant).index) + 1;
              *(undefined8 *)((long)&(((ConstantsList *)local_48)->constant).value + 8) =
                   *(undefined8 *)(&(item->constant).type + (long)count * 2);
              *(undefined4 *)&((ConstantsList *)local_48)->next = 0;
              *(undefined4 *)((long)&((ConstantsList *)local_48)->next + 4) = 0xffffffff;
              *(ConstantsList **)&((ConstantsList *)((long)local_48 + 0x20))->constant = array[0x9b]
              ;
              array[0x9b] = (ConstantsList *)local_48;
            }
            count = tmp._4_4_;
          }
          else {
            var._4_4_ = var._4_4_ + 1;
          }
          hi = tmp._4_4_;
        }
      }
    }
  }
  return;
}

Assistant:

static void determine_constants_arrays(Context *ctx)
{
    // Only process this stuff once. This is called after all DEF* opcodes
    //  could have been parsed.
    if (ctx->determined_constants_arrays)
        return;

    ctx->determined_constants_arrays = 1;

    if (ctx->constant_count <= 1)
        return;  // nothing to sort or group.

    // Sort the linked list into an array for easier tapdancing...
    ConstantsList **array = (ConstantsList **) alloca(sizeof (ConstantsList *) * (ctx->constant_count + 1));
    ConstantsList *item = ctx->constants;
    int i;

    for (i = 0; i < ctx->constant_count; i++)
    {
        if (item == NULL)
        {
            fail(ctx, "BUG: mismatched constant list and count");
            return;
        } // if

        array[i] = item;
        item = item->next;
    } // for

    array[ctx->constant_count] = NULL;

    // bubble sort ftw.
    int sorted;
    do
    {
        sorted = 1;
        for (i = 0; i < ctx->constant_count-1; i++)
        {
            if (array[i]->constant.index > array[i+1]->constant.index)
            {
                ConstantsList *tmp = array[i];
                array[i] = array[i+1];
                array[i+1] = tmp;
                sorted = 0;
            } // if
        } // for
    } while (!sorted);

    // okay, sorted. While we're here, let's redo the linked list in order...
    for (i = 0; i < ctx->constant_count; i++)
        array[i]->next = array[i+1];
    ctx->constants = array[0];

    // now figure out the groupings of constants and add to ctx->variables...
    int start = -1;
    int prev = -1;
    int count = 0;
    const int hi = ctx->constant_count;
    for (i = 0; i <= hi; i++)
    {
        if (array[i] && (array[i]->constant.type != MOJOSHADER_UNIFORM_FLOAT))
            continue;  // we only care about REG_TYPE_CONST for array groups.

        if (start == -1)
        {
            prev = start = i;  // first REG_TYPE_CONST we've seen. Mark it!
            continue;
        } // if

        // not a match (or last item in the array)...see if we had a
        //  contiguous set before this point...
        if ( (array[i]) && (array[i]->constant.index == (array[prev]->constant.index + 1)) )
            count++;
        else
        {
            if (count > 0)  // multiple constants in the set?
            {
                VariableList *var;
                var = (VariableList *) Malloc(ctx, sizeof (VariableList));
                if (var == NULL)
                    break;

                var->type = MOJOSHADER_UNIFORM_FLOAT;
                var->index = array[start]->constant.index;
                var->count = (array[prev]->constant.index - var->index) + 1;
                var->constant = array[start];
                var->used = 0;
                var->emit_position = -1;
                var->next = ctx->variables;
                ctx->variables = var;
            } // else

            start = i;   // set this as new start of sequence.
        } // if

        prev = i;
    } // for
}